

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  bool bVar1;
  const_iterator pcVar2;
  const_iterator pcVar3;
  LogMessage *pLVar4;
  ostream *poVar5;
  uint8_t *puVar6;
  size_type *psVar7;
  StringPiece *in_RSI;
  long in_RDI;
  StartInfo *info;
  uint32_t flags;
  int start;
  StringPiece *context;
  StringPiece *text;
  memory_order __b;
  LogMessage *in_stack_fffffffffffffc60;
  DFA *in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc80;
  int line;
  char *in_stack_fffffffffffffc88;
  LogMessage *in_stack_fffffffffffffc90;
  uint32_t in_stack_fffffffffffffcdc;
  StartInfo *in_stack_fffffffffffffce0;
  SearchParams *in_stack_fffffffffffffce8;
  DFA *in_stack_fffffffffffffcf0;
  uint local_1c8;
  LogMessage local_1b8;
  StringPiece *local_38;
  StringPiece *local_30;
  StringPiece *local_28;
  undefined4 local_14;
  int local_c;
  size_type *local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  local_38 = in_RSI + 1;
  local_30 = in_RSI;
  local_28 = in_RSI;
  pcVar2 = StringPiece::begin(in_RSI);
  pcVar3 = StringPiece::begin(local_38);
  if (pcVar3 <= pcVar2) {
    in_stack_fffffffffffffc90 = (LogMessage *)StringPiece::end(local_30);
    pLVar4 = (LogMessage *)StringPiece::end(local_38);
    if (in_stack_fffffffffffffc90 <= pLVar4) {
      if (((ulong)local_28[2].data_ & 0x10000) == 0) {
        pcVar2 = StringPiece::end(local_30);
        pcVar3 = StringPiece::end(local_38);
        if (pcVar2 == pcVar3) {
          local_1c8 = 0;
        }
        else {
          pcVar2 = StringPiece::end(local_30);
          if (*pcVar2 == '\n') {
            local_1c8 = 2;
          }
          else {
            puVar6 = (uint8_t *)StringPiece::end(local_30);
            bVar1 = Prog::IsWordChar(*puVar6);
            if (bVar1) {
              local_1c8 = 4;
            }
            else {
              local_1c8 = 6;
            }
          }
        }
      }
      else {
        pcVar2 = StringPiece::begin(local_30);
        pcVar3 = StringPiece::begin(local_38);
        if (pcVar2 == pcVar3) {
          local_1c8 = 0;
        }
        else {
          pcVar2 = StringPiece::begin(local_30);
          if (pcVar2[-1] == '\n') {
            local_1c8 = 2;
          }
          else {
            pcVar2 = StringPiece::begin(local_30);
            bVar1 = Prog::IsWordChar(pcVar2[-1]);
            if (bVar1) {
              local_1c8 = 4;
            }
            else {
              local_1c8 = 6;
            }
          }
        }
      }
      if (((ulong)local_28[2].data_ & 1) != 0) {
        local_1c8 = local_1c8 | 1;
      }
      psVar7 = (size_type *)(in_RDI + 0xe8 + (long)(int)local_1c8 * 0x10);
      bVar1 = AnalyzeSearchHelper(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                                  in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      if (!bVar1) {
        ResetCache(in_stack_fffffffffffffc68,(RWLocker *)in_stack_fffffffffffffc60);
        bVar1 = AnalyzeSearchHelper(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                                    in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
        if (!bVar1) {
          pLVar4 = (LogMessage *)&stack0xfffffffffffffca8;
          LogMessage::LogMessage(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,line);
          poVar5 = LogMessage::stream(pLVar4);
          std::operator<<(poVar5,"Failed to analyze start state.");
          LogMessage::~LogMessage(pLVar4);
          *(undefined1 *)&local_28[4].data_ = 1;
          return false;
        }
      }
      local_28[2].size_ = *psVar7;
      psVar7 = psVar7 + 1;
      local_c = 2;
      local_8 = psVar7;
      std::operator&(memory_order_acquire,__memory_order_mask);
      if (local_c - 1U < 2) {
        local_14 = (undefined4)*psVar7;
      }
      else if (local_c == 5) {
        local_14 = (undefined4)*psVar7;
      }
      else {
        local_14 = (undefined4)*psVar7;
      }
      *(undefined4 *)&local_28[3].data_ = local_14;
      return true;
    }
  }
  pLVar4 = &local_1b8;
  LogMessage::LogMessage
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(int)((ulong)pLVar4 >> 0x20));
  poVar5 = LogMessage::stream(pLVar4);
  std::operator<<(poVar5,"context does not contain text");
  LogMessage::~LogMessage(in_stack_fffffffffffffc60);
  local_28[2].size_ = 1;
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "context does not contain text";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint32_t flags;
  if (params->run_forward) {
    if (text.begin() == context.begin()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.begin()[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.begin()[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (text.end() == context.end()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.end()[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.end()[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored)
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      LOG(DFATAL) << "Failed to analyze start state.";
      params->failed = true;
      return false;
    }
  }

  if (ExtraDebug)
    fprintf(stderr, "anchored=%d fwd=%d flags=%#x state=%s first_byte=%d\n",
            params->anchored, params->run_forward, flags,
            DumpState(info->start).c_str(), info->first_byte.load());

  params->start = info->start;
  params->first_byte = info->first_byte.load(std::memory_order_acquire);

  return true;
}